

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isFBOStatusValid(ValidStatusCodes *this,GLenum fboStatus)

{
  GLenum *pGVar1;
  int iVar2;
  ulong uVar3;
  pointer pRVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (fboStatus == 0x8cd5) {
    return this->m_allowComplete;
  }
  pRVar4 = (this->m_errorStatuses).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_errorStatuses).
                 super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4) / 0x38;
  iVar2 = (int)uVar3;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar2) {
    uVar6 = uVar3 & 0xffffffff;
  }
  do {
    if (uVar6 == uVar5) {
      return (long)uVar5 < (long)iVar2;
    }
    uVar5 = uVar5 + 1;
    pGVar1 = &pRVar4->errorCode;
    pRVar4 = pRVar4 + 1;
  } while (*pGVar1 != fboStatus);
  return true;
}

Assistant:

bool ValidStatusCodes::isFBOStatusValid (glw::GLenum fboStatus) const
{
	if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
		return m_allowComplete;
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		{
			if (m_errorStatuses[ndx].errorCode == fboStatus)
				return true;
		}
		return false;
	}
}